

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void __thiscall libcellml::Model::Model(Model *this,string *name)

{
  ModelImpl *this_00;
  
  this_00 = (ModelImpl *)operator_new(0xa0);
  memset(this_00,0,0xa0);
  ModelImpl::ModelImpl(this_00);
  ComponentEntity::ComponentEntity(&this->super_ComponentEntity,(ComponentEntityImpl *)this_00);
  (this->super_enable_shared_from_this<libcellml::Model>)._M_weak_this.
  super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<libcellml::Model>)._M_weak_this.
  super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
       (_func_int **)&PTR__Model_002a0050;
  NamedEntity::setName((NamedEntity *)this,name);
  return;
}

Assistant:

Model::Model(const std::string &name)
    : ComponentEntity(new Model::ModelImpl())
{
    setName(name);
}